

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem
          (UnderwaterAcousticEmitterSystem *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticEmitterSystem_00225b90;
  this->m_ui8EmitterSystemDataLength = '\x05';
  this->m_ui8NumBeams = '\0';
  this->m_ui16Padding1 = 0;
  AcousticEmitterSystem::AcousticEmitterSystem(&this->m_AES);
  Vector::Vector(&this->m_Location);
  (this->m_vUAEB).
  super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vUAEB).
  super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vUAEB).
  super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem() :
    m_ui8EmitterSystemDataLength( UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE / 4 ),
    m_ui8NumBeams( 0 ),
    m_ui16Padding1( 0 )
{
}